

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IDataBlob> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IDataBlob>::operator=
          (RefCntAutoPtr<Diligent::IDataBlob> *this,RefCntAutoPtr<Diligent::DataBlobImpl> *AutoPtr)

{
  DataBlobImpl *pObj;
  RefCntAutoPtr<Diligent::DataBlobImpl> *AutoPtr_local;
  RefCntAutoPtr<Diligent::IDataBlob> *this_local;
  
  if ((DataBlobImpl *)this->m_pObject != AutoPtr->m_pObject) {
    pObj = RefCntAutoPtr<Diligent::DataBlobImpl>::Detach(AutoPtr);
    Attach(this,(IDataBlob *)pObj);
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr<DerivedType>&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }